

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# relaxng.c
# Opt level: O2

void xmlRelaxNGCheckCombine(void *payload,void *data,xmlChar *name)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  xmlChar *str1;
  xmlRelaxNGDefinePtr_conflict payload_00;
  xmlRelaxNGDefinePtr pxVar4;
  xmlHashTablePtr pxVar5;
  char *msg;
  xmlRelaxNGDefinePtr *ppxVar6;
  xmlNodePtr node;
  xmlChar *str2;
  xmlRelaxNGDefinePtr pxVar7;
  void *pvVar8;
  bool bVar9;
  char tmpname [32];
  
  if (*(long *)((long)payload + 0x58) != 0) {
    bVar1 = false;
    iVar3 = -1;
    for (pvVar8 = payload; pvVar8 != (void *)0x0; pvVar8 = *(void **)((long)pvVar8 + 0x58)) {
      str1 = xmlGetProp(*(xmlNode **)((long)pvVar8 + 8),(xmlChar *)"combine");
      if (str1 == (xmlChar *)0x0) {
        if (bVar1) {
          xmlRngPErr((xmlRelaxNGParserCtxtPtr)data,*(xmlNodePtr *)((long)payload + 8),0x41e,
                     "Some defines for %s needs the combine attribute\n",name,(xmlChar *)0x0);
        }
        bVar1 = true;
      }
      else {
        iVar2 = xmlStrEqual(str1,(xmlChar *)"choice");
        if (iVar2 == 0) {
          iVar2 = xmlStrEqual(str1,(xmlChar *)"interleave");
          if (iVar2 == 0) {
            node = *(xmlNodePtr *)((long)payload + 8);
            iVar2 = 0x45a;
            msg = "Defines for %s use unknown combine value \'%s\'\'\n";
            str2 = str1;
            goto LAB_00180cab;
          }
          bVar9 = iVar3 == 1;
          iVar3 = 0;
          if (bVar9) {
            xmlRngPErr((xmlRelaxNGParserCtxtPtr)data,*(xmlNodePtr *)((long)payload + 8),0x3f2,
                       "Defines for %s use both \'choice\' and \'interleave\'\n",name,(xmlChar *)0x0
                      );
            iVar3 = 1;
          }
        }
        else {
          bVar9 = iVar3 == 0;
          iVar3 = 1;
          if (bVar9) {
            node = *(xmlNodePtr *)((long)payload + 8);
            iVar3 = 0;
            iVar2 = 0x3f2;
            msg = "Defines for %s use both \'choice\' and \'interleave\'\n";
            str2 = (xmlChar *)0x0;
LAB_00180cab:
            xmlRngPErr((xmlRelaxNGParserCtxtPtr)data,node,iVar2,msg,name,str2);
          }
        }
        (*xmlFree)(str1);
      }
    }
    payload_00 = xmlRelaxNGNewDefine((xmlRelaxNGParserCtxtPtr)data,
                                     *(xmlNodePtr *)((long)payload + 8));
    if (payload_00 != (xmlRelaxNGDefinePtr_conflict)0x0) {
      payload_00->type = (uint)(iVar3 + 1U < 2) * 2 + XML_RELAXNG_CHOICE;
      pxVar7 = (xmlRelaxNGDefinePtr)0x0;
      for (pvVar8 = payload; pvVar8 != (void *)0x0; pvVar8 = *(void **)((long)pvVar8 + 0x58)) {
        pxVar4 = *(xmlRelaxNGDefinePtr *)((long)pvVar8 + 0x30);
        if (pxVar4 != (xmlRelaxNGDefinePtr)0x0) {
          if (pxVar4->next != (xmlRelaxNGDefinePtr)0x0) {
            pxVar4 = xmlRelaxNGNewDefine((xmlRelaxNGParserCtxtPtr)data,pxVar4->node);
            if (pxVar4 == (xmlRelaxNGDefinePtr_conflict)0x0) break;
            pxVar4->type = XML_RELAXNG_GROUP;
            pxVar4->content = *(xmlRelaxNGDefinePtr *)((long)pvVar8 + 0x30);
          }
          ppxVar6 = &pxVar7->next;
          if (pxVar7 == (xmlRelaxNGDefinePtr)0x0) {
            ppxVar6 = &payload_00->content;
          }
          *ppxVar6 = pxVar4;
          pxVar7 = pxVar4;
        }
        *(xmlRelaxNGDefinePtr_conflict *)((long)pvVar8 + 0x30) = payload_00;
      }
      *(xmlRelaxNGDefinePtr_conflict *)((long)payload + 0x30) = payload_00;
      if (iVar3 + 1U < 2) {
        if (*(long *)((long)data + 0x68) == 0) {
          pxVar5 = xmlHashCreate(10);
          *(xmlHashTablePtr *)((long)data + 0x68) = pxVar5;
          if (pxVar5 == (xmlHashTablePtr)0x0) {
            xmlRngPErr((xmlRelaxNGParserCtxtPtr)data,*(xmlNodePtr *)((long)payload + 8),0x416,
                       "Failed to create interleaves hash table\n",(xmlChar *)0x0,(xmlChar *)0x0);
            return;
          }
        }
        *(int *)((long)data + 0x60) = *(int *)((long)data + 0x60) + 1;
        snprintf(tmpname,0x20,"interleave%d");
        iVar3 = xmlHashAddEntry(*(xmlHashTablePtr *)((long)data + 0x68),(xmlChar *)tmpname,
                                payload_00);
        if (iVar3 < 0) {
          xmlRngPErr((xmlRelaxNGParserCtxtPtr)data,*(xmlNodePtr *)((long)payload + 8),0x416,
                     "Failed to add %s to hash table\n",(xmlChar *)tmpname,(xmlChar *)0x0);
        }
      }
    }
  }
  return;
}

Assistant:

static void
xmlRelaxNGCheckCombine(void *payload, void *data, const xmlChar * name)
{
    xmlRelaxNGDefinePtr define = (xmlRelaxNGDefinePtr) payload;
    xmlRelaxNGParserCtxtPtr ctxt = (xmlRelaxNGParserCtxtPtr) data;
    xmlChar *combine;
    int choiceOrInterleave = -1;
    int missing = 0;
    xmlRelaxNGDefinePtr cur, last, tmp, tmp2;

    if (define->nextHash == NULL)
        return;
    cur = define;
    while (cur != NULL) {
        combine = xmlGetProp(cur->node, BAD_CAST "combine");
        if (combine != NULL) {
            if (xmlStrEqual(combine, BAD_CAST "choice")) {
                if (choiceOrInterleave == -1)
                    choiceOrInterleave = 1;
                else if (choiceOrInterleave == 0) {
                    xmlRngPErr(ctxt, define->node, XML_RNGP_DEF_CHOICE_AND_INTERLEAVE,
                               "Defines for %s use both 'choice' and 'interleave'\n",
                               name, NULL);
                }
            } else if (xmlStrEqual(combine, BAD_CAST "interleave")) {
                if (choiceOrInterleave == -1)
                    choiceOrInterleave = 0;
                else if (choiceOrInterleave == 1) {
                    xmlRngPErr(ctxt, define->node, XML_RNGP_DEF_CHOICE_AND_INTERLEAVE,
                               "Defines for %s use both 'choice' and 'interleave'\n",
                               name, NULL);
                }
            } else {
                xmlRngPErr(ctxt, define->node, XML_RNGP_UNKNOWN_COMBINE,
                           "Defines for %s use unknown combine value '%s''\n",
                           name, combine);
            }
            xmlFree(combine);
        } else {
            if (missing == 0)
                missing = 1;
            else {
                xmlRngPErr(ctxt, define->node, XML_RNGP_NEED_COMBINE,
                           "Some defines for %s needs the combine attribute\n",
                           name, NULL);
            }
        }

        cur = cur->nextHash;
    }
    if (choiceOrInterleave == -1)
        choiceOrInterleave = 0;
    cur = xmlRelaxNGNewDefine(ctxt, define->node);
    if (cur == NULL)
        return;
    if (choiceOrInterleave == 0)
        cur->type = XML_RELAXNG_INTERLEAVE;
    else
        cur->type = XML_RELAXNG_CHOICE;
    tmp = define;
    last = NULL;
    while (tmp != NULL) {
        if (tmp->content != NULL) {
            if (tmp->content->next != NULL) {
                /*
                 * we need first to create a wrapper.
                 */
                tmp2 = xmlRelaxNGNewDefine(ctxt, tmp->content->node);
                if (tmp2 == NULL)
                    break;
                tmp2->type = XML_RELAXNG_GROUP;
                tmp2->content = tmp->content;
            } else {
                tmp2 = tmp->content;
            }
            if (last == NULL) {
                cur->content = tmp2;
            } else {
                last->next = tmp2;
            }
            last = tmp2;
        }
        tmp->content = cur;
        tmp = tmp->nextHash;
    }
    define->content = cur;
    if (choiceOrInterleave == 0) {
        if (ctxt->interleaves == NULL)
            ctxt->interleaves = xmlHashCreate(10);
        if (ctxt->interleaves == NULL) {
            xmlRngPErr(ctxt, define->node, XML_RNGP_INTERLEAVE_CREATE_FAILED,
                       "Failed to create interleaves hash table\n", NULL,
                       NULL);
        } else {
            char tmpname[32];

            snprintf(tmpname, 32, "interleave%d", ctxt->nbInterleaves++);
            if (xmlHashAddEntry(ctxt->interleaves, BAD_CAST tmpname, cur) <
                0) {
                xmlRngPErr(ctxt, define->node, XML_RNGP_INTERLEAVE_CREATE_FAILED,
                           "Failed to add %s to hash table\n",
			   (const xmlChar *) tmpname, NULL);
            }
        }
    }
}